

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOService.cpp
# Opt level: O0

void anon_unknown.dwarf_46d210::init_curious_in_channel(Caliper *c,Channel *channel)

{
  curious_t cVar1;
  Events *pEVar2;
  user_data_t *this;
  pointer puVar3;
  __uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  local_50;
  pair<unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>
  local_48 [2];
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  local_28;
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  data;
  curious_t curious_inst;
  Channel *channel_local;
  Caliper *c_local;
  
  channel_local = (Channel *)c;
  pEVar2 = cali::Channel::events(channel);
  cali::util::callback<void(cali::Caliper*,cali::Attribute_const&)>::operator()
            (&pEVar2->subscribe_attribute,(Caliper **)&channel_local,
             (Attribute *)&(anonymous_namespace)::io_region_attr);
  data._M_t.
  super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_ =
       curious_init(3);
  this = (user_data_t *)operator_new(0x18);
  user_data_t::user_data_t
            (this,data._M_t.
                  super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
                  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl.
                  _4_4_,channel);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::user_data_t>,void>
            ((unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>
              *)&local_28,this);
  cVar1 = data._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_;
  puVar3 = std::
           unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
           ::get(&local_28);
  curious_register_callback(cVar1,0,handle_io<curious_read_record>,puVar3);
  cVar1 = data._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_;
  puVar3 = std::
           unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
           ::get(&local_28);
  curious_register_callback(cVar1,1,handle_io<curious_read_record>,puVar3);
  cVar1 = data._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_;
  puVar3 = std::
           unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
           ::get(&local_28);
  curious_register_callback(cVar1,2,handle_io<curious_write_record>,puVar3);
  cVar1 = data._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_;
  puVar3 = std::
           unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
           ::get(&local_28);
  curious_register_callback(cVar1,3,handle_io<curious_write_record>,puVar3);
  cVar1 = data._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_;
  puVar3 = std::
           unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
           ::get(&local_28);
  curious_register_callback(cVar1,4,handle_io<curious_metadata_record>,puVar3);
  cVar1 = data._M_t.
          super___uniq_ptr_impl<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          ._M_t.
          super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
          .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl._4_4_;
  puVar3 = std::
           unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
           ::get(&local_28);
  curious_register_callback(cVar1,5,handle_io<curious_metadata_record>,puVar3);
  local_50._M_t.
  super__Tuple_impl<0UL,_(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  .super__Head_base<0UL,_(anonymous_namespace)::user_data_t_*,_false>._M_head_impl =
       (tuple<(anonymous_namespace)::user_data_t_*,_std::default_delete<(anonymous_namespace)::user_data_t>_>
        )cali::Channel::id(channel);
  std::
  make_pair<unsigned_long,std::unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>>
            (&local_48[0].first,
             (unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
              *)&local_50);
  std::
  unordered_map<unsigned_long,std::unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>>>>
  ::
  insert<std::pair<unsigned_long,std::unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>>>
            ((unordered_map<unsigned_long,std::unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<(anonymous_namespace)::user_data_t,std::default_delete<(anonymous_namespace)::user_data_t>>>>>
              *)(anonymous_namespace)::curious_insts,local_48);
  std::
  pair<unsigned_long,_std::unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>_>
  ::~pair(local_48);
  std::
  unique_ptr<(anonymous_namespace)::user_data_t,_std::default_delete<(anonymous_namespace)::user_data_t>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

void init_curious_in_channel(Caliper* c, Channel* channel)
{
    channel->events().subscribe_attribute(c, io_region_attr);

    curious_t curious_inst = curious_init(CURIOUS_ALL_APIS);
    auto      data         = std::unique_ptr<user_data_t>(new user_data_t { curious_inst, *channel });

    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_READ_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_read_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_write_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );
    curious_register_callback(
        curious_inst,
        CURIOUS_METADATA_CALLBACK | CURIOUS_POST_CALLBACK,
        (curious_callback_f) handle_io<curious_metadata_record_t>,
        data.get()
    );

    curious_insts.insert(std::make_pair(channel->id(), std::move(data)));
}